

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# taskq.c
# Opt level: O1

void nni_task_dispatch(nni_task *task)

{
  nni_taskq *list;
  
  if (task->task_cb != (nni_cb)0x0) {
    list = task->task_tq;
    nni_mtx_lock(&task->task_mtx);
    if (task->task_prep == true) {
      task->task_prep = false;
    }
    else {
      task->task_busy = task->task_busy + 1;
    }
    nni_mtx_unlock(&task->task_mtx);
    nni_mtx_lock(&list->tq_mtx);
    nni_list_append(&list->tq_tasks,task);
    nni_cv_wake1(&list->tq_sched_cv);
    nni_mtx_unlock(&list->tq_mtx);
    return;
  }
  nni_task_exec(task);
  return;
}

Assistant:

void
nni_task_dispatch(nni_task *task)
{
	nni_taskq *tq = task->task_tq;

	// If there is no callback to perform, then do nothing!
	// The user will be none the wiser.
	if (task->task_cb == NULL) {
		nni_task_exec(task);
		return;
	}
	nni_mtx_lock(&task->task_mtx);
	if (task->task_prep) {
		task->task_prep = false;
	} else {
		task->task_busy++;
	}
	nni_mtx_unlock(&task->task_mtx);

	nni_mtx_lock(&tq->tq_mtx);
	nni_list_append(&tq->tq_tasks, task);
	nni_cv_wake1(&tq->tq_sched_cv); // waking just one waiter is adequate
	nni_mtx_unlock(&tq->tq_mtx);
}